

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

void FFTProcess<double>(UnityComplexNumber *data,int numsamples,bool forward)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  double _re;
  double _im;
  double local_98;
  undefined1 local_90 [8];
  UnityComplexNumberT<double> t;
  int local_78;
  int i_1;
  int m_1;
  int step;
  UnityComplexNumberT<double> wd;
  UnityComplexNumberT<double> wr;
  double dStack_48;
  int j_2;
  double w0;
  uint j_1;
  uint i;
  uint m;
  uint k;
  uint j;
  uint n;
  uint *tbl;
  uint numbits;
  uint count;
  bool forward_local;
  int numsamples_local;
  UnityComplexNumber *data_local;
  
  tbl._0_4_ = 0;
  for (tbl._4_4_ = 1; tbl._4_4_ < (uint)numsamples; tbl._4_4_ = tbl._4_4_ * 2) {
    tbl._0_4_ = (uint)tbl + 1;
  }
  _j = FFTProcess<double>::reversetable[(uint)tbl];
  if (_j == (uint *)0x0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)numsamples;
    uVar3 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    _j = (uint *)operator_new__(uVar3);
    for (k = 0; k < (uint)numsamples; k = k + 1) {
      m = 1;
      i = 0;
      for (j_1 = numsamples >> 1; j_1 != 0; j_1 = j_1 >> 1) {
        if ((k & j_1) != 0) {
          i = m | i;
        }
        m = m * 2;
      }
      _j[k] = i;
    }
    FFTProcess<double>::reversetable[(uint)tbl] = _j;
  }
  for (w0._4_4_ = 0; w0._4_4_ < (uint)numsamples; w0._4_4_ = w0._4_4_ + 1) {
    uVar1 = _j[w0._4_4_];
    if (w0._4_4_ < uVar1) {
      UnitySwap<float>(&data[w0._4_4_].re,&data[uVar1].re);
      UnitySwap<float>(&data[w0._4_4_].im,&data[uVar1].im);
    }
  }
  local_98 = -3.141592653589793;
  if (!forward) {
    local_98 = 3.141592653589793;
  }
  dStack_48 = local_98;
  for (wr.im._4_4_ = 1; wr.im._4_4_ < numsamples; wr.im._4_4_ = wr.im._4_4_ * 2) {
    _re = cos(dStack_48);
    _im = sin(dStack_48);
    UnityComplexNumberT<double>::Set((UnityComplexNumberT<double> *)&wd.im,_re,_im);
    UnityComplexNumberT<double>::Set((UnityComplexNumberT<double> *)&m_1,1.0,0.0);
    for (local_78 = 0; local_78 < wr.im._4_4_; local_78 = local_78 + 1) {
      for (t.im._4_4_ = local_78; t.im._4_4_ < numsamples; t.im._4_4_ = wr.im._4_4_ * 2 + t.im._4_4_
          ) {
        UnityComplexNumberT<float>::Mul<double,float,double>
                  ((UnityComplexNumberT<double> *)&m_1,data + (t.im._4_4_ + wr.im._4_4_),
                   (UnityComplexNumberT<double> *)local_90);
        UnityComplexNumberT<float>::Sub<float,double,float>
                  (data + t.im._4_4_,(UnityComplexNumberT<double> *)local_90,
                   data + (t.im._4_4_ + wr.im._4_4_));
        UnityComplexNumberT<float>::Add<float,double,float>
                  (data + t.im._4_4_,(UnityComplexNumberT<double> *)local_90,data + t.im._4_4_);
      }
      UnityComplexNumberT<float>::Mul<double,double,double>
                ((UnityComplexNumberT<double> *)&m_1,(UnityComplexNumberT<double> *)&wd.im,
                 (UnityComplexNumberT<double> *)&m_1);
    }
    dStack_48 = dStack_48 * 0.5;
  }
  return;
}

Assistant:

static void FFTProcess(UnityComplexNumber* data, int numsamples, bool forward)
{
    unsigned int count = 1, numbits = 0;
    while (count < numsamples)
    {
        count += count;
        ++numbits;
    }

    static unsigned int* reversetable[32] = { NULL };
    unsigned int* tbl = reversetable[numbits];
    if (tbl == NULL)
    {
        tbl = new unsigned int[numsamples];
        for (unsigned int n = 0; n < numsamples; n++)
        {
            unsigned int j = 1, k = 0, m = numsamples >> 1;
            while (m > 0)
            {
                if (n & m)
                    k |= j;
                j += j;
                m >>= 1;
            }
            tbl[n] = k;
        }
#if ENABLE_TESTS
        for (unsigned int n = 0; n < numsamples; n++)
        {
            assert(tbl[tbl[n]] == n);
        }
#endif
        reversetable[numbits] = tbl;
    }

    for (unsigned int i = 0; i < numsamples; i++)
    {
        unsigned int j = tbl[i];
        if (i < j)
        {
            UnitySwap(data[i].re, data[j].re);
            UnitySwap(data[i].im, data[j].im);
        }
    }

    T w0 = (forward) ? -T(kPI_double) : T(kPI_double);
    for (int j = 1; j < numsamples; j += j)
    {
        UnityComplexNumberT<T> wr, wd;
        wr.Set(T(cos(w0)), T(sin(w0)));
        wd.Set(T(1.0), T(0.0));
        int step = j + j;
        for (int m = 0; m < j; ++m)
        {
            for (int i = m; i < numsamples; i += step)
            {
                UnityComplexNumberT<T> t;
                UnityComplexNumber::Mul(wd, data[i + j], t);
                UnityComplexNumber::Sub(data[i], t, data[i + j]);
                UnityComplexNumber::Add(data[i], t, data[i]);
            }
            UnityComplexNumber::Mul(wd, wr, wd);
        }
        w0 *= T(0.5);
    }
}